

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O1

void __thiscall
TPZSkylMatrix<std::complex<float>_>::CopyFrom
          (TPZSkylMatrix<std::complex<float>_> *this,TPZMatrix<std::complex<float>_> *mat)

{
  TPZSkylMatrix<std::complex<float>_> *A;
  
  if (mat == (TPZMatrix<std::complex<float>_> *)0x0) {
    A = (TPZSkylMatrix<std::complex<float>_> *)0x0;
  }
  else {
    A = (TPZSkylMatrix<std::complex<float>_> *)
        __dynamic_cast(mat,&TPZMatrix<std::complex<float>>::typeinfo,
                       &TPZSkylMatrix<std::complex<float>>::typeinfo,0);
  }
  if (A != (TPZSkylMatrix<std::complex<float>_> *)0x0) {
    (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x4e])(this);
    Copy(this,A);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZSkylMatrix<std::complex<float>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = std::complex<float>]"
             ,0x6f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Aborting...\n",0xc);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzskylmat.h",
             0x74);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override
  {                                                           
    auto *from = dynamic_cast<const TPZSkylMatrix<TVar> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }